

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O0

int normal_scanPercent(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  int iVar1;
  XML_Convert_Result XVar2;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *pcVar3;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  unsigned_short *in_R8;
  char **nextTokPtr_local;
  char *end_local;
  char *ptr_local;
  ENCODING *enc_local;
  
  if ((long)end - (long)ptr < 1) {
    return -1;
  }
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
  case 5:
    if ((long)end - (long)ptr < 2) {
      return -2;
    }
    iVar1 = (*enc[3].scanners[1])(enc,ptr,end,(char **)ptr);
    if (iVar1 == 0) {
      *nextTokPtr = ptr;
      return 0;
    }
    end_local = ptr + 2;
    pcVar3 = extraout_RDX;
    break;
  case 6:
    if ((long)end - (long)ptr < 3) {
      return -2;
    }
    iVar1 = (*enc[3].scanners[2])(enc,ptr,end,(char **)ptr);
    if (iVar1 == 0) {
      *nextTokPtr = ptr;
      return 0;
    }
    end_local = ptr + 3;
    pcVar3 = extraout_RDX_00;
    break;
  case 7:
    if ((long)end - (long)ptr < 4) {
      return -2;
    }
    iVar1 = (*enc[3].literalScanners[0])(enc,ptr,end,(char **)ptr);
    if (iVar1 == 0) {
      *nextTokPtr = ptr;
      return 0;
    }
    end_local = ptr + 4;
    pcVar3 = extraout_RDX_01;
    break;
  default:
    *nextTokPtr = ptr;
    return 0;
  case 9:
  case 10:
  case 0x15:
  case 0x1e:
    *nextTokPtr = ptr;
    return 0x16;
  case 0x16:
  case 0x18:
    end_local = ptr + 1;
    pcVar3 = end;
    break;
  case 0x1d:
    *nextTokPtr = ptr;
    return 0;
  }
  do {
    if ((long)end - (long)end_local < 1) {
      return -1;
    }
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*end_local)) {
    case 5:
      if ((long)end - (long)end_local < 2) {
        return -2;
      }
      XVar2 = (*enc[2].utf16Convert)
                        (enc,(char **)end_local,pcVar3,(unsigned_short **)end_local,in_R8);
      if (XVar2 == XML_CONVERT_COMPLETED) {
        *nextTokPtr = end_local;
        return 0;
      }
      end_local = end_local + 2;
      pcVar3 = extraout_RDX_02;
      break;
    case 6:
      if ((long)end - (long)end_local < 3) {
        return -2;
      }
      iVar1 = (**(code **)&enc[2].minBytesPerChar)(enc,end_local);
      if (iVar1 == 0) {
        *nextTokPtr = end_local;
        return 0;
      }
      end_local = end_local + 3;
      pcVar3 = extraout_RDX_03;
      break;
    case 7:
      if ((long)end - (long)end_local < 4) {
        return -2;
      }
      iVar1 = (*enc[3].scanners[0])(enc,end_local,pcVar3,(char **)end_local);
      if (iVar1 == 0) {
        *nextTokPtr = end_local;
        return 0;
      }
      end_local = end_local + 4;
      pcVar3 = extraout_RDX_04;
      break;
    default:
      *nextTokPtr = end_local;
      return 0;
    case 0x12:
      *nextTokPtr = end_local + 1;
      return 0x1c;
    case 0x16:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
      end_local = end_local + 1;
      break;
    case 0x1d:
      *nextTokPtr = end_local;
      return 0;
    }
  } while( true );
}

Assistant:

static int PTRCALL
PREFIX(scanPercent)(const ENCODING *enc, const char *ptr, const char *end,
                    const char **nextTokPtr)
{
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
  CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_S: case BT_LF: case BT_CR: case BT_PERCNT:
    *nextTokPtr = ptr;
    return XML_TOK_PERCENT;
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_SEMI:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_PARAM_ENTITY_REF;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}